

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall
SuiteTimeRangeTests::TestisInSameRangeWithDay::RunImpl(TestisInSameRangeWithDay *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_b0;
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  
  FIX::UtcTimeOnly::UtcTimeOnly(&startTime,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly(&endTime,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time1.super_DateTime,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime,3,0,0,0x19,7,0x7d4);
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x112);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x1f,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x1b,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x117);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x1b,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x1b,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x11c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,0x1a,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x1b,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x121);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,0x1b,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,0x1d,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x126);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,0x1b,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x14,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,299);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,0x1b,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x14,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x130);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,0x1a,7,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,3,0,0,0x13,7,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x135);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0,5,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x17,0x2d,0,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0,0,0,4,4,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,1,0,0,3,4,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,7,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x142);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0,0,0,0x1e,10,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,1,0,0,0x1f,10,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,7,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x147);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,10,10,0x1f,0xc,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,10,10,1,1,0x7d7);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,7,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x14c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,-1,-1,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x151);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x16,0x1c,0x14,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x16,0x1c,5,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x16,0x1c,2,0x10,1,0x7e4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x16,0x1e,0x2f,0x10,1,0x7e4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,5,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x159);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x16,0x18,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x16,0xf,0x1e,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x12,0xf,0xf,0xf,1,0x7e4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x16,0x1a,0x14,0x10,1,0x7e4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,5,5,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x15f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,9,1,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,8,0x3b,0,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,3,0xc,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,3,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x168);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,10,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x16a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,4,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x16c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,1,0,3,0xc,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,10,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x170);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,8,1,0,10,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x172);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,8,1,0,5,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,1,1,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x174);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,9,1,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,8,0x3b,0,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,3,0xc,0x7d6);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,5,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,2,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x17d);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,9,1,0,0xb,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,2,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x17f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,8,1,0,3,0xc,0x7d6);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,2,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x181);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x11,0,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x10,2,0x1e,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x17,4,3,0x11,1,0x7e4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,6,0,0,0x13,1,0x7e4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,2,2,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x18a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x11,0,0,0);
  startTime.super_DateTime._8_8_ = local_b0.testName;
  startTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x10,2,0x1e,0);
  endTime.super_DateTime._8_8_ = local_b0.testName;
  endTime.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x17,4,3,0x11,1,0x7e4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,6,0,0,0x14,1,0x7e4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange
                    (&startTime,&endTime,4,4,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x192);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  return;
}

Assistant:

TEST(isInSameRangeWithDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 5;

  UtcTimeStamp time1( 3, 0, 0, 27, 7, 2004 );
  UtcTimeStamp time2( 3, 0, 0, 25, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 31, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 2, 0, 0, 29, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 19, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  // Reset start/end time so that they fall within an hour of midnight
  startTime = UtcTimeOnly(0, 5, 0);
  endTime = UtcTimeOnly(23, 45, 0);

  // Make it a week-long session
  startDay = 1;
  endDay = 7;

  // Check that ST-->DST (Sunday is missing one hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 4, 4, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 3, 4, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that DST-->ST (Sunday has an extra hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 30, 10, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 31, 10, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that everything works across a year boundary
  time1 = UtcTimeStamp(10, 10, 10, 31, 12, 2006);
  time2 = UtcTimeStamp(10, 10, 10, 1, 1, 2007);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that "missing" start and end days are handled as isSameSession without days
  startDay = -1;
  endDay = -1;
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 5;
  endDay = 5;
  startTime = UtcTimeOnly(22, 28, 20);
  endTime = UtcTimeOnly(22, 28, 5);
  time1 = UtcTimeStamp(22, 28, 2, 16, 1, 2020); // session
  time2 = UtcTimeStamp(22, 30, 47, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startTime = UtcTimeOnly(22, 24, 0);
  endTime = UtcTimeOnly(22, 15, 30);
  time1 = UtcTimeStamp(18, 15, 15, 15, 1, 2020); // session
  time2 = UtcTimeStamp(22, 26, 20, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same
  startDay = 1;
  endDay = 1;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 4, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  time1 = UtcTimeStamp(10, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 10, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 5, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same, and not today
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006); // day before swap
  time2 = UtcTimeStamp(9, 1, 0, 5, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 11, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Re-creating weekend cert reset
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 19, 1, 2020); // 20200119-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 4;
  endDay = 4;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 20, 1, 2020); // 20200120-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
}